

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string_view __thiscall
google::protobuf::Reflection::GetRepeatedStringView
          (Reflection *this,Message *message,FieldDescriptor *field,int index,ScratchSpace *scratch)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  bool v1;
  char *description;
  Descriptor *pDVar3;
  Metadata MVar4;
  string_view sVar5;
  
  MVar4 = Message::GetMetadata(message);
  if (MVar4.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar4 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar3,MVar4.descriptor,field,"GetRepeatedStringView");
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ == pDVar3) {
    bVar1 = field->field_0x1;
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
          sVar5 = GetRepeatedStringViewImpl(this,message,field,index,scratch);
          return sVar5;
        }
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetRepeatedStringView",CPPTYPE_STRING);
      }
    }
    else {
      GetRepeatedStringView();
    }
    pDVar3 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"GetRepeatedStringView",description);
}

Assistant:

absl::string_view Reflection::GetRepeatedStringView(
    const Message& message, const FieldDescriptor* field, int index,
    ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetRepeatedStringView, REPEATED, STRING);
  return GetRepeatedStringViewImpl(message, field, index, &scratch);
}